

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O2

bool __thiscall S2Polyline::Decode(S2Polyline *this,Decoder *decoder)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  size_t sVar6;
  ulong uVar7;
  pointer __p;
  ulong uVar8;
  S2LogMessage local_40;
  
  sVar6 = Decoder::avail(decoder);
  if (4 < sVar6) {
    pbVar3 = decoder->buf_;
    bVar1 = *pbVar3;
    decoder->buf_ = pbVar3 + 1;
    if (bVar1 < 2) {
      iVar2 = *(int *)(pbVar3 + 1);
      decoder->buf_ = pbVar3 + 5;
      this->num_vertices_ = iVar2;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)iVar2;
      uVar7 = SUB168(auVar4 * ZEXT816(0x18),0);
      uVar8 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
        uVar8 = uVar7;
      }
      __p = (pointer)operator_new__(uVar8);
      if (iVar2 != 0) {
        uVar7 = uVar7 - 0x18;
        memset(__p,0,(uVar7 - uVar7 % 0x18) + 0x18);
      }
      std::__uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>::reset
                ((__uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_> *)
                 &this->vertices_,__p);
      sVar6 = Decoder::avail(decoder);
      uVar8 = (long)this->num_vertices_ * 0x18;
      if (uVar8 <= sVar6) {
        memcpy((this->vertices_)._M_t.
               super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
               super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
               super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl,decoder->buf_,uVar8);
        decoder->buf_ = decoder->buf_ + uVar8;
        if (FLAGS_s2debug != true) {
          return true;
        }
        if (this->s2debug_override_ != ALLOW) {
          return true;
        }
        bVar5 = IsValid(this);
        if (bVar5) {
          return true;
        }
        S2LogMessage::S2LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
                   ,0x16f,kFatal,(ostream *)&std::cerr);
        std::operator<<(local_40.stream_,"Check failed: IsValid() ");
        abort();
      }
    }
  }
  return false;
}

Assistant:

bool S2Polyline::Decode(Decoder* const decoder) {
  if (decoder->avail() < sizeof(unsigned char) + sizeof(uint32)) return false;
  unsigned char version = decoder->get8();
  if (version > kCurrentLosslessEncodingVersionNumber) return false;

  num_vertices_ = decoder->get32();
  vertices_.reset(new S2Point[num_vertices_]);
  if (decoder->avail() < num_vertices_ * sizeof(vertices_[0])) return false;
  decoder->getn(&vertices_[0], num_vertices_ * sizeof(vertices_[0]));

  if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
    S2_CHECK(IsValid());
  }
  return true;
}